

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O1

STRING_HANDLE URL_EncodeString(char *textEncode)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  char *memory;
  STRING_HANDLE pSVar5;
  LOGGER_LOG p_Var6;
  ulong __size;
  byte bVar7;
  char cVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  
  if (textEncode == (char *)0x0) {
    return (STRING_HANDLE)0x0;
  }
  __size = 0;
  pbVar4 = (byte *)textEncode;
  do {
    bVar1 = *pbVar4;
    uVar11 = 0xfffffffffffffffe;
    if ((((0x2e < (ulong)bVar1) || ((0x670200000001U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
        (9 < (byte)(bVar1 - 0x30))) && ((bVar1 != 0x5f && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))))
    {
      uVar11 = (ulong)(-1 < (char)bVar1) * 3 - 7;
    }
    sVar3 = 0xffffffffffffffff;
    if (__size < uVar11) {
      lVar12 = 1;
      if (((0x2e < bVar1) || ((0x670200000001U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
         ((9 < (byte)(bVar1 - 0x30) && ((bVar1 != 0x5f && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))))
         ) {
        lVar12 = (ulong)(bVar1 >> 7) * 3 + 3;
      }
      sVar3 = lVar12 + __size;
    }
    __size = sVar3;
    pbVar4 = pbVar4 + 1;
  } while (bVar1 != 0);
  if ((__size != 0xffffffffffffffff) && (memory = (char *)malloc(__size), memory != (char *)0x0)) {
    lVar12 = 0;
    do {
      bVar1 = *textEncode;
      if (((((ulong)bVar1 < 0x2f) && ((0x670200000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
          ((byte)(bVar1 - 0x30) < 10)) ||
         ((bVar1 == 0x5f || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)))) {
        memory[lVar12] = bVar1;
        lVar9 = 1;
      }
      else {
        bVar7 = bVar1 & 0xf;
        bVar2 = (bVar1 >> 4) - 4;
        if (bVar1 < 0xc0) {
          bVar2 = bVar1 >> 4;
        }
        bVar10 = bVar2 + 0x57;
        if (bVar2 < 10) {
          bVar10 = bVar2 | 0x30;
        }
        cVar8 = bVar7 + 0x57;
        if (bVar7 < 10) {
          cVar8 = bVar7 + 0x30;
        }
        memory[lVar12] = '%';
        if ((char)bVar1 < '\0') {
          memory[lVar12 + 1] = 'c';
          memory[lVar12 + 3] = '%';
          memory[lVar12 + 4] = bVar10;
          memory[lVar12 + 5] = cVar8;
          if (bVar1 < 0xc0) {
            memory[lVar12 + 2] = '2';
          }
          else {
            memory[lVar12 + 2] = '3';
          }
          lVar9 = 6;
        }
        else {
          memory[lVar12 + 1] = bVar10;
          memory[lVar12 + 2] = cVar8;
          lVar9 = 3;
        }
      }
      textEncode = (char *)((byte *)textEncode + 1);
      lVar12 = lVar12 + lVar9;
    } while (bVar1 != 0);
    pSVar5 = STRING_new_with_memory(memory);
    if (pSVar5 == (STRING_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
                  ,"encode_url_data",0x101,1,"URL_Encode:: MALLOC failure on encode.");
      }
      free(memory);
      return (STRING_HANDLE)0x0;
    }
    return pSVar5;
  }
  p_Var6 = xlogging_get_log_function();
  if (p_Var6 != (LOGGER_LOG)0x0) {
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
              ,"encode_url_data",0xf2,1,"URL_Encode:: MALLOC failure on encode. size=%zu",__size);
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_EncodeString(const char* textEncode)
{
    STRING_HANDLE result;
    if (textEncode == NULL)
    {
        result = NULL;
    }
    else
    {
        result = encode_url_data(textEncode);
    }
    return result;
}